

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O1

void __thiscall
p2t::Sweep::FlipEdgeEvent(Sweep *this,SweepContext *tcx,Point *ep,Point *eq,Triangle *t,Point *p)

{
  double dVar1;
  double dVar2;
  double dVar3;
  Edge *pEVar4;
  bool bVar5;
  Triangle *this_00;
  Point *pd;
  Point *pb;
  Point *pc;
  Point *pPVar6;
  uint o;
  double dVar7;
  
  do {
    this_00 = Triangle::NeighborAcross(t,p);
    pd = Triangle::OppositePoint(this_00,t,p);
    pb = Triangle::PointCCW(t,p);
    pc = Triangle::PointCW(t,p);
    pPVar6 = p;
    bVar5 = InScanArea(p,pb,pc,pd);
    if (!bVar5) {
      pPVar6 = NextFlipPoint((Sweep *)pPVar6,ep,eq,this_00,pd);
      FlipScanEdgeEvent(this,tcx,ep,eq,t,this_00,pPVar6);
      EdgeEvent(this,tcx,ep,eq,t,p);
      return;
    }
    RotateTrianglePair((Sweep *)pPVar6,t,p,this_00,pd);
    SweepContext::MapTriangleToNodes(tcx,t);
    SweepContext::MapTriangleToNodes(tcx,this_00);
    dVar7 = eq->x;
    dVar1 = eq->y;
    if ((((p->x == dVar7) && (!NAN(p->x) && !NAN(dVar7))) && (p->y == dVar1)) &&
       (!NAN(p->y) && !NAN(dVar1))) {
      dVar2 = ep->x;
      if ((pd->x == dVar2) && (!NAN(pd->x) && !NAN(dVar2))) {
        dVar3 = ep->y;
        if ((pd->y == dVar3) && (!NAN(pd->y) && !NAN(dVar3))) {
          pEVar4 = (tcx->edge_event).constrained_edge;
          pPVar6 = pEVar4->q;
          if ((((dVar7 == pPVar6->x) && (!NAN(dVar7) && !NAN(pPVar6->x))) && (dVar1 == pPVar6->y))
             && (!NAN(dVar1) && !NAN(pPVar6->y))) {
            pPVar6 = pEVar4->p;
            if ((((dVar2 == pPVar6->x) && (!NAN(dVar2) && !NAN(pPVar6->x))) && (dVar3 == pPVar6->y))
               && (!NAN(dVar3) && !NAN(pPVar6->y))) {
              Triangle::MarkConstrainedEdge(t,ep,eq);
              Triangle::MarkConstrainedEdge(this_00,ep,eq);
              Legalize(this,tcx,t);
              Legalize(this,tcx,this_00);
              return;
            }
          }
          return;
        }
      }
    }
    dVar7 = (pd->y - ep->y) * (dVar7 - ep->x) - (pd->x - ep->x) * (dVar1 - ep->y);
    o = (uint)(0.0 < dVar7);
    if (ABS(dVar7) < 1e-12) {
      o = 2;
    }
    t = NextFlipTriangle(this,tcx,o,t,this_00,p,pd);
  } while( true );
}

Assistant:

void Sweep::FlipEdgeEvent(SweepContext& tcx, Point& ep, Point& eq, Triangle* t, Point& p)
{
  Triangle& ot = t->NeighborAcross(p);
  Point& op = *ot.OppositePoint(*t, p);

  if (InScanArea(p, *t->PointCCW(p), *t->PointCW(p), op)) {
    // Lets rotate shared edge one vertex CW
    RotateTrianglePair(*t, p, ot, op);
    tcx.MapTriangleToNodes(*t);
    tcx.MapTriangleToNodes(ot);

    if (p == eq && op == ep) {
      if (eq == *tcx.edge_event.constrained_edge->q && ep == *tcx.edge_event.constrained_edge->p) {
        t->MarkConstrainedEdge(&ep, &eq);
        ot.MarkConstrainedEdge(&ep, &eq);
        Legalize(tcx, *t);
        Legalize(tcx, ot);
      } else {
        // XXX: I think one of the triangles should be legalized here?
      }
    } else {
      Orientation o = Orient2d(eq, op, ep);
      t = &NextFlipTriangle(tcx, (int)o, *t, ot, p, op);
      FlipEdgeEvent(tcx, ep, eq, t, p);
    }
  } else {
    Point& newP = NextFlipPoint(ep, eq, ot, op);
    FlipScanEdgeEvent(tcx, ep, eq, *t, ot, newP);
    EdgeEvent(tcx, ep, eq, t, p);
  }
}